

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

void __thiscall
capnp::SchemaFile::DiskSchemaFile::reportError
          (DiskSchemaFile *this,SourcePos start,SourcePos end,StringPtr message)

{
  char *pcVar1;
  size_t sVar2;
  ExceptionCallback *pEVar3;
  String local_1f8;
  String local_1d8;
  PathPtr local_1b8;
  Exception local_1a8;
  
  pEVar3 = kj::getExceptionCallback();
  local_1b8.parts.ptr = (this->path).parts.ptr;
  local_1b8.parts.size_ = (this->path).parts.size_;
  kj::PathPtr::toString(&local_1d8,&local_1b8,false);
  kj::heapString(&local_1f8,message.content.ptr,message.content.size_ - 1);
  kj::Exception::Exception(&local_1a8,FAILED,&local_1d8,start.line,&local_1f8);
  (*pEVar3->_vptr_ExceptionCallback[2])(pEVar3,&local_1a8);
  kj::Exception::~Exception(&local_1a8);
  sVar2 = local_1f8.content.size_;
  pcVar1 = local_1f8.content.ptr;
  if (local_1f8.content.ptr != (char *)0x0) {
    local_1f8.content.ptr = (char *)0x0;
    local_1f8.content.size_ = 0;
    (**(local_1f8.content.disposer)->_vptr_ArrayDisposer)
              (local_1f8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_1d8.content.size_;
  pcVar1 = local_1d8.content.ptr;
  if (local_1d8.content.ptr != (char *)0x0) {
    local_1d8.content.ptr = (char *)0x0;
    local_1d8.content.size_ = 0;
    (**(local_1d8.content.disposer)->_vptr_ArrayDisposer)
              (local_1d8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

void reportError(SourcePos start, SourcePos end, kj::StringPtr message) const override {
    kj::getExceptionCallback().onRecoverableException(kj::Exception(
        kj::Exception::Type::FAILED, path.toString(), start.line,
        kj::heapString(message)));
  }